

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<sophia_interface*,bool,double,double,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul>
          (argument_loader<sophia_interface*,bool,double,double,bool> *this,long call)

{
  long lVar1;
  bool bVar2;
  char local_1d [4];
  bool local_19;
  
  local_1d[0] = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                          ((type_caster_generic *)(this + 0x20),
                           (PyObject *)**(undefined8 **)(call + 8),
                           (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  local_1d[1] = type_caster<bool,_void>::load
                          ((type_caster<bool,_void> *)(this + 0x18),
                           *(PyObject **)(*(long *)(call + 8) + 8),
                           SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  local_1d[2] = type_caster<double,_void>::load
                          ((type_caster<double,_void> *)(this + 0x10),
                           *(PyObject **)(*(long *)(call + 8) + 0x10),
                           SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  local_1d[3] = type_caster<double,_void>::load
                          ((type_caster<double,_void> *)(this + 8),
                           *(PyObject **)(*(long *)(call + 8) + 0x18),
                           SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
  local_19 = type_caster<bool,_void>::load
                       ((type_caster<bool,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 0x20),
                        SUB41((**(uint **)(call + 0x20) & 0x10) >> 4,0));
  lVar1 = 0;
  do {
    if (local_1d[lVar1] != '\x01') {
      return (bool)local_1d[lVar1];
    }
    bVar2 = lVar1 != 4;
    lVar1 = lVar1 + 1;
  } while (bVar2);
  return true;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }